

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rxcollector.cpp
# Opt level: O3

QVariantList * __thiscall
RXCollector::modelsLists
          (QVariantList *__return_storage_ptr__,RXCollector *this,QList<QStringListModel_*> *models)

{
  long lVar1;
  QArrayDataPointer<QString> local_60;
  QVariant local_48;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QVariant *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (0 < (models->d).size) {
    lVar1 = 0;
    do {
      QStringListModel::stringList();
      QVariant::QVariant(&local_48,(QList *)&local_60);
      QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
                ((QMovableArrayOps<QVariant> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_48);
      QVariant::~QVariant(&local_48);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_60);
      lVar1 = lVar1 + 1;
    } while (lVar1 < (models->d).size);
  }
  return __return_storage_ptr__;
}

Assistant:

QVariantList RXCollector::modelsLists(const QList<QStringListModel *> &models) {
    QVariantList exps;
    for(int i=0;i<models.size();i++) {
        QStringListModel* m = models[i];
        exps.append(m->stringList());
    }
    return exps;
}